

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

DelayedSequenceElementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DelayedSequenceElementSyntax,slang::parsing::Token&,slang::syntax::ExpressionSyntax*&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::SelectorSyntax*&,slang::parsing::Token&,slang::syntax::SequenceExprSyntax&>
          (BumpAllocator *this,Token *args,ExpressionSyntax **args_1,Token *args_2,Token *args_3,
          SelectorSyntax **args_4,Token *args_5,SequenceExprSyntax *args_6)

{
  Token openBracket;
  Token doubleHash;
  Token closeBracket;
  DelayedSequenceElementSyntax *pDVar1;
  Token *in_RCX;
  undefined8 *in_RSI;
  SequenceExprSyntax *in_R8;
  Info *in_R9;
  undefined8 *in_stack_00000008;
  DelayedSequenceElementSyntax *in_stack_00000010;
  size_t in_stack_ffffffffffffff58;
  size_t in_stack_ffffffffffffff60;
  BumpAllocator *in_stack_ffffffffffffff68;
  
  pDVar1 = (DelayedSequenceElementSyntax *)
           allocate(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  doubleHash.info = *(Info **)&in_R8->super_SyntaxNode;
  doubleHash._0_8_ = (ExpressionSyntax *)in_stack_00000008[1];
  openBracket.info = (Info *)*in_stack_00000008;
  openBracket._0_8_ = pDVar1;
  closeBracket.info = in_R9;
  closeBracket._0_8_ = in_RSI[1];
  slang::syntax::DelayedSequenceElementSyntax::DelayedSequenceElementSyntax
            (in_stack_00000010,doubleHash,(ExpressionSyntax *)in_stack_00000008[1],openBracket,
             *in_RCX,(SelectorSyntax *)*in_RSI,closeBracket,in_R8);
  return pDVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }